

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderSupplementalData.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::Mode5TransponderSupplementalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5TransponderSupplementalData *this)

{
  ostream *poVar1;
  KStringStream ss;
  byte local_1a1;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Mode 5 Transponder Supplemental Data:",0x25);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tSquitter: ",0xc);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(local_190,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLevel 2 Squiter: ",0x13);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tIFF Mission: ",0xf);
  local_1a1 = (this->m_SupplementalDataUnion).m_ui8SupplementalData >> 2 & 7;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1a1,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5TransponderSupplementalData::GetAsString() const
{
    KStringStream ss;	
	ss << "Mode 5 Transponder Supplemental Data:"
	   << "\n\tSquitter: "        << ( KBOOL )m_SupplementalDataUnion.m_ui8SquitterStatus 
	   << "\n\tLevel 2 Squiter: " << ( KBOOL )m_SupplementalDataUnion.m_ui8Lvl2SquitterStatus
	   << "\n\tIFF Mission: "     << m_SupplementalDataUnion.m_ui8IFFMission
	   << "\n";
    return ss.str();
}